

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O3

void __thiscall
ft::
treeBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::BSTerase(treeBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *this,iterator *position)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Colour CVar2;
  treeNode<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ptVar3;
  pointer pcVar4;
  treeNode<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ptVar5;
  treeNode<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ptVar6;
  treeNode<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ptVar7;
  treeNode<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ptVar8;
  Colour CVar9;
  treeNode<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *x;
  bool bVar10;
  
  ptVar6 = (this->m_tree).NIL;
  ((this->m_tree).m_first)->parent->left = ptVar6;
  ((this->m_tree).m_last)->parent->right = ptVar6;
  ptVar3 = position->m_node;
  CVar9 = ptVar3->colour;
  ptVar7 = ptVar3->left;
  x = ptVar3->right;
  if (ptVar7 == ptVar6) {
    if ((this->m_tree).m_root == ptVar3) {
      (this->m_tree).m_root = x;
      ptVar6 = ptVar3->parent;
    }
    else {
      ptVar6 = ptVar3->parent;
      if (ptVar6->left == ptVar3) {
        ptVar6->left = x;
      }
      else if (ptVar6->right == ptVar3) {
        ptVar6->right = x;
      }
    }
    x->parent = ptVar6;
  }
  else if (x == ptVar6) {
    if ((this->m_tree).m_root == ptVar3) {
      (this->m_tree).m_root = ptVar7;
      ptVar6 = ptVar3->parent;
    }
    else {
      ptVar6 = ptVar3->parent;
      if (ptVar6->left == ptVar3) {
        ptVar6->left = ptVar7;
      }
      else if (ptVar6->right == ptVar3) {
        ptVar6->right = ptVar7;
      }
    }
    ptVar7->parent = ptVar6;
    x = ptVar7;
  }
  else {
    ptVar6 = position->m_tree->NIL;
    ptVar7 = ptVar3;
    ptVar8 = x;
    if (x == ptVar6) {
      do {
        ptVar5 = ptVar7->parent;
        ptVar6 = ptVar5->right;
        bVar10 = ptVar6 == ptVar7;
        ptVar7 = ptVar5;
      } while (bVar10);
    }
    else {
      do {
        ptVar5 = ptVar8;
        ptVar8 = ptVar5->left;
      } while (ptVar5->left != ptVar6);
      ptVar6 = ptVar5->right;
    }
    CVar2 = ptVar5->colour;
    ptVar7 = ptVar5->parent;
    if (ptVar7 == ptVar3) {
      ptVar6->parent = ptVar5;
      ptVar8 = (this->m_tree).m_root;
    }
    else {
      ptVar8 = (this->m_tree).m_root;
      if (ptVar8 == ptVar5) {
        (this->m_tree).m_root = ptVar6;
        ptVar8 = ptVar6;
      }
      else if (ptVar7->left == ptVar5) {
        ptVar7->left = ptVar6;
      }
      else if (ptVar7->right == ptVar5) {
        ptVar7->right = ptVar6;
        x = ptVar3->right;
      }
      ptVar6->parent = ptVar7;
      ptVar5->right = x;
      x->parent = ptVar5;
    }
    if (ptVar8 == ptVar3) {
      (this->m_tree).m_root = ptVar5;
      ptVar7 = ptVar3->parent;
    }
    else {
      ptVar7 = ptVar3->parent;
      if (ptVar7->left == ptVar3) {
        ptVar7->left = ptVar5;
      }
      else if (ptVar7->right == ptVar3) {
        ptVar7->right = ptVar5;
      }
    }
    ptVar5->parent = ptVar7;
    ptVar7 = ptVar3->left;
    ptVar5->left = ptVar7;
    ptVar7->parent = ptVar5;
    ptVar5->colour = CVar9;
    x = ptVar6;
    CVar9 = CVar2;
  }
  pcVar4 = (ptVar3->value).second._M_dataplus._M_p;
  paVar1 = &(ptVar3->value).second.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(ptVar3);
  if (CVar9 == BLACK) {
    fixEraseViolation(this,x);
  }
  attach(this);
  return;
}

Assistant:

void	BSTerase(iterator position) {
		this->detach();

		node*	z = position.node();
		node*	y = z;
		node*	x = NULL;
		enum Colour	origYColour = y->colour;

		if (z->left == this->NIL()) { // z has only right child or no children
			x = z->right;
			this->transplant(z, z->right);
		}
		else if (z->right == this->NIL()) { // z has only left child
			x = z->left;
			this->transplant(z, z->left);
		}
		else { // z has two children
			iterator temp = position;
			++temp;
			y = temp.node();

			origYColour = y->colour;
			x = y->right;
			if (y->parent == z)
				x->parent = y;
			else {
				this->transplant(y, y->right);
				y->right = z->right;
				y->right->parent = y;
			}
			this->transplant(z, y);
			y->left = z->left;
			y->left->parent = y;
			y->colour = z->colour;
		}

		this->m_alloc.destroy(z);
		this->m_alloc.deallocate(z, 1);

		if (origYColour == BLACK) {
			this->fixEraseViolation(x);
		}

		this->attach();
	}